

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

ImVec2 ImGui::FindBestWindowPosForPopupEx
                 (ImVec2 *ref_pos,ImVec2 *size,ImGuiDir *last_dir,ImRect *r_outer,ImRect *r_avoid,
                 ImGuiPopupPositionPolicy policy)

{
  float fVar1;
  undefined1 auVar2 [16];
  ImVec2 IVar3;
  ImVec2 IVar4;
  undefined4 in_EAX;
  uint uVar5;
  ulong uVar6;
  ImGuiDir *pIVar7;
  byte bVar8;
  undefined8 unaff_RBX;
  int *piVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  uint uVar14;
  ImVec2 IVar16;
  float fVar15;
  float fVar22;
  undefined1 auVar17 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  ImVec2 IVar34;
  ImVec2 IVar35;
  undefined1 auVar18 [16];
  
  IVar35 = r_outer->Max;
  fVar27 = IVar35.x;
  fVar28 = IVar35.y;
  fVar23 = (r_outer->Min).x;
  fVar24 = (r_outer->Min).y;
  fVar15 = (*size).x;
  fVar22 = (*size).y;
  fVar33 = fVar28 - fVar22;
  fVar25 = (*ref_pos).x;
  fVar26 = (*ref_pos).y;
  iVar10 = -(uint)(fVar27 - fVar15 < fVar25);
  iVar12 = -(uint)(fVar33 < fVar26);
  auVar17._4_4_ = iVar12;
  auVar17._0_4_ = iVar10;
  auVar17._8_4_ = iVar12;
  auVar17._12_4_ = iVar12;
  auVar21._8_8_ = auVar17._8_8_;
  auVar21._4_4_ = iVar10;
  auVar21._0_4_ = iVar10;
  uVar5 = movmskpd(in_EAX,auVar21);
  if ((uVar5 & 2) == 0) {
    fVar33 = fVar26;
  }
  fVar32 = fVar27 - fVar15;
  if ((uVar5 & 1) == 0) {
    fVar32 = fVar25;
  }
  iVar10 = *last_dir;
  fVar1 = (r_avoid->Min).x;
  if (policy == ImGuiPopupPositionPolicy_ComboBox) {
    uVar6 = (ulong)(iVar10 == -1);
    fVar30 = (r_avoid->Min).y;
    fVar29 = (r_avoid->Max).x;
    IVar3.y = fVar30 - fVar22;
    IVar3.x = fVar29 - fVar15;
    fVar31 = (r_avoid->Max).y;
    IVar4.y = fVar30 - fVar22;
    IVar4.x = fVar1;
    IVar16.y = fVar31;
    IVar16.x = fVar1;
    piVar9 = (int *)(&DAT_0065b5a0 + (ulong)(iVar10 != -1) * -4);
    do {
      pIVar7 = last_dir;
      if (uVar6 != 0) {
        pIVar7 = piVar9;
      }
      iVar12 = *pIVar7;
      if ((uVar6 == 0) || (iVar12 != iVar10)) {
        switch(iVar12) {
        case 0:
          IVar34.y = fVar31;
          IVar34.x = fVar29 - fVar15;
          break;
        case 1:
          IVar34 = IVar4;
          break;
        case 2:
          IVar34 = IVar3;
          break;
        case 3:
          IVar34 = IVar16;
          break;
        default:
          IVar34.x = 0.0;
          IVar34.y = 0.0;
        }
        iVar11 = -(uint)(fVar15 + IVar34.x <= fVar27);
        iVar13 = -(uint)(fVar22 + IVar34.y <= fVar28);
        auVar19._4_4_ = iVar13;
        auVar19._0_4_ = iVar11;
        auVar19._8_4_ = iVar13;
        auVar19._12_4_ = iVar13;
        auVar18._8_8_ = auVar19._8_8_;
        auVar18._4_4_ = iVar11;
        auVar18._0_4_ = iVar11;
        uVar5 = movmskpd((int)unaff_RBX,auVar18);
        bVar8 = (byte)((ulong)uVar5 & 0xffffffffffffff02) >> 1;
        unaff_RBX = CONCAT71((int7)(((ulong)uVar5 & 0xffffffffffffff02) >> 8),bVar8);
        if ((-(fVar24 <= IVar34.y && fVar23 <= IVar34.x) & (byte)uVar5 & bVar8) == 1) {
          *last_dir = iVar12;
          return IVar34;
        }
      }
      uVar6 = uVar6 + 1;
      piVar9 = piVar9 + 1;
    } while (uVar6 != 5);
  }
  else {
    fVar30 = (r_avoid->Min).y;
    fVar29 = (r_avoid->Max).x;
    fVar31 = (r_avoid->Max).y;
  }
  fVar33 = (float)(-(uint)(fVar26 < fVar24) & (uint)fVar24 |
                  ~-(uint)(fVar26 < fVar24) & (uint)fVar33);
  fVar25 = (float)(-(uint)(fVar25 < fVar23) & (uint)fVar23 |
                  ~-(uint)(fVar25 < fVar23) & (uint)fVar32);
  uVar6 = (ulong)(iVar10 == -1);
  piVar9 = (int *)(&DAT_0065fad0 + (ulong)(iVar10 != -1) * -4);
  do {
    pIVar7 = last_dir;
    if (uVar6 != 0) {
      pIVar7 = piVar9;
    }
    iVar12 = *pIVar7;
    if ((uVar6 == 0) || (iVar12 != iVar10)) {
      fVar26 = fVar1;
      if (iVar12 != 0) {
        fVar26 = fVar27;
      }
      fVar32 = fVar29;
      if (iVar12 != 1) {
        fVar32 = fVar23;
      }
      if (fVar15 <= fVar26 - fVar32) {
        fVar26 = fVar30;
        if (iVar12 != 2) {
          fVar26 = fVar28;
        }
        fVar32 = fVar31;
        if (iVar12 != 3) {
          fVar32 = fVar24;
        }
        if (fVar22 <= fVar26 - fVar32) {
          if (iVar12 == 0) {
            fVar29 = fVar1 - fVar15;
          }
          else if (iVar12 != 1) {
            fVar29 = fVar25;
            if (iVar12 == 2) {
              fVar33 = (r_avoid->Min).y - fVar22;
            }
            else if (iVar12 == 3) {
              fVar33 = (r_avoid->Max).y;
            }
          }
          IVar35.y = fVar33;
          IVar35.x = fVar29;
          *last_dir = iVar12;
          return IVar35;
        }
      }
    }
    uVar6 = uVar6 + 1;
    piVar9 = piVar9 + 1;
    if (uVar6 == 5) {
      *last_dir = -1;
      auVar20._0_4_ = (*ref_pos).x + fVar15;
      auVar20._4_4_ = (*ref_pos).y + fVar22;
      auVar20._8_8_ = 0;
      auVar2._8_8_ = 0;
      auVar2._0_4_ = IVar35.x;
      auVar2._4_4_ = IVar35.y;
      auVar21 = minps(auVar20,auVar2);
      fVar15 = auVar21._0_4_ - fVar15;
      fVar22 = auVar21._4_4_ - fVar22;
      uVar5 = -(uint)(fVar23 <= fVar15);
      uVar14 = -(uint)(fVar24 <= fVar22);
      return (ImVec2)(CONCAT44(~uVar14 & (uint)fVar24,~uVar5 & (uint)fVar23) |
                     CONCAT44((uint)fVar22 & uVar14,(uint)fVar15 & uVar5));
    }
  } while( true );
}

Assistant:

ImVec2 ImGui::FindBestWindowPosForPopupEx(const ImVec2& ref_pos, const ImVec2& size, ImGuiDir* last_dir, const ImRect& r_outer, const ImRect& r_avoid, ImGuiPopupPositionPolicy policy)
{
    ImVec2 base_pos_clamped = ImClamp(ref_pos, r_outer.Min, r_outer.Max - size);
    //GetForegroundDrawList()->AddRect(r_avoid.Min, r_avoid.Max, IM_COL32(255,0,0,255));
    //GetForegroundDrawList()->AddRect(r_outer.Min, r_outer.Max, IM_COL32(0,255,0,255));

    // Combo Box policy (we want a connecting edge)
    if (policy == ImGuiPopupPositionPolicy_ComboBox)
    {
        const ImGuiDir dir_prefered_order[ImGuiDir_COUNT] = { ImGuiDir_Down, ImGuiDir_Right, ImGuiDir_Left, ImGuiDir_Up };
        for (int n = (*last_dir != ImGuiDir_None) ? -1 : 0; n < ImGuiDir_COUNT; n++)
        {
            const ImGuiDir dir = (n == -1) ? *last_dir : dir_prefered_order[n];
            if (n != -1 && dir == *last_dir) // Already tried this direction?
                continue;
            ImVec2 pos;
            if (dir == ImGuiDir_Down)  pos = ImVec2(r_avoid.Min.x, r_avoid.Max.y);          // Below, Toward Right (default)
            if (dir == ImGuiDir_Right) pos = ImVec2(r_avoid.Min.x, r_avoid.Min.y - size.y); // Above, Toward Right
            if (dir == ImGuiDir_Left)  pos = ImVec2(r_avoid.Max.x - size.x, r_avoid.Max.y); // Below, Toward Left
            if (dir == ImGuiDir_Up)    pos = ImVec2(r_avoid.Max.x - size.x, r_avoid.Min.y - size.y); // Above, Toward Left
            if (!r_outer.Contains(ImRect(pos, pos + size)))
                continue;
            *last_dir = dir;
            return pos;
        }
    }

    // Default popup policy
    const ImGuiDir dir_prefered_order[ImGuiDir_COUNT] = { ImGuiDir_Right, ImGuiDir_Down, ImGuiDir_Up, ImGuiDir_Left };
    for (int n = (*last_dir != ImGuiDir_None) ? -1 : 0; n < ImGuiDir_COUNT; n++)
    {
        const ImGuiDir dir = (n == -1) ? *last_dir : dir_prefered_order[n];
        if (n != -1 && dir == *last_dir) // Already tried this direction?
            continue;
        float avail_w = (dir == ImGuiDir_Left ? r_avoid.Min.x : r_outer.Max.x) - (dir == ImGuiDir_Right ? r_avoid.Max.x : r_outer.Min.x);
        float avail_h = (dir == ImGuiDir_Up ? r_avoid.Min.y : r_outer.Max.y) - (dir == ImGuiDir_Down ? r_avoid.Max.y : r_outer.Min.y);
        if (avail_w < size.x || avail_h < size.y)
            continue;
        ImVec2 pos;
        pos.x = (dir == ImGuiDir_Left) ? r_avoid.Min.x - size.x : (dir == ImGuiDir_Right) ? r_avoid.Max.x : base_pos_clamped.x;
        pos.y = (dir == ImGuiDir_Up)   ? r_avoid.Min.y - size.y : (dir == ImGuiDir_Down)  ? r_avoid.Max.y : base_pos_clamped.y;
        *last_dir = dir;
        return pos;
    }

    // Fallback, try to keep within display
    *last_dir = ImGuiDir_None;
    ImVec2 pos = ref_pos;
    pos.x = ImMax(ImMin(pos.x + size.x, r_outer.Max.x) - size.x, r_outer.Min.x);
    pos.y = ImMax(ImMin(pos.y + size.y, r_outer.Max.y) - size.y, r_outer.Min.y);
    return pos;
}